

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

uint256 * ComputeTapleafHash(uint256 *__return_storage_ptr__,uint8_t leaf_version,
                            Span<const_unsigned_char> script)

{
  base_blob<256U> *pbVar1;
  long lVar2;
  uint32_t *puVar3;
  CSHA256 *pCVar4;
  long in_FS_OFFSET;
  uint8_t local_91;
  CSHA256 local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (uint32_t *)&HASHER_TAPLEAF;
  pCVar4 = &local_90;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pCVar4->s = *(undefined8 *)puVar3;
    puVar3 = puVar3 + 2;
    pCVar4 = (CSHA256 *)(pCVar4->s + 2);
  }
  local_91 = leaf_version;
  CSHA256::Write(&local_90,&local_91,1);
  WriteCompactSize<HashWriter>((HashWriter *)&local_90,script.m_size);
  CSHA256::Write(&local_90,script.m_data,script.m_size);
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  (pbVar1->m_data)._M_elems[0x1c] = '\0';
  (pbVar1->m_data)._M_elems[0x1d] = '\0';
  (pbVar1->m_data)._M_elems[0x1e] = '\0';
  (pbVar1->m_data)._M_elems[0x1f] = '\0';
  CSHA256::Finalize(&local_90,(uchar *)__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ComputeTapleafHash(uint8_t leaf_version, Span<const unsigned char> script)
{
    return (HashWriter{HASHER_TAPLEAF} << leaf_version << CompactSizeWriter(script.size()) << script).GetSHA256();
}